

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_byteArray_primitive_copyFromUntil
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  sysbvm_size_t sVar3;
  sysbvm_tuple_t type;
  sysbvm_object_tuple_t *psVar4;
  size_t local_78;
  sysbvm_byteArray_t *copy;
  sysbvm_type_tuple_t *arrayTypeObject;
  sysbvm_tuple_t arrayType;
  size_t copySize;
  size_t endIndex;
  size_t startIndex;
  size_t size;
  sysbvm_byteArray_t *array;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 3) {
    sysbvm_error_argumentCountMismatch(3,argumentCount);
  }
  sVar1 = *arguments;
  sVar2 = sysbvm_tuple_getSizeInBytes(*arguments);
  sVar3 = sysbvm_tuple_size_decode(arguments[1]);
  copySize = sysbvm_tuple_size_decode(arguments[2]);
  if (sVar2 <= copySize) {
    copySize = sVar2;
  }
  if (copySize < sVar3) {
    local_78 = 0;
  }
  else {
    local_78 = copySize - sVar3;
  }
  type = sysbvm_tuple_getType(context,*arguments);
  if (local_78 == 0) {
    if (*(long *)(type + 0x78) == 0) {
      psVar4 = sysbvm_context_allocateByteTuple(context,type,0);
      *(sysbvm_object_tuple_t **)(type + 0x78) = psVar4;
    }
    context_local = *(sysbvm_context_t **)(type + 0x78);
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_context_allocateByteTuple(context,type,local_78);
    memcpy((anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)
           &(context_local->heap).shouldAttemptToCollect,(void *)(sVar1 + 0x10 + sVar3),local_78);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_byteArray_primitive_copyFromUntil(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 3) sysbvm_error_argumentCountMismatch(3, argumentCount);

    sysbvm_byteArray_t *array = (sysbvm_byteArray_t *)arguments[0];
    size_t size = sysbvm_tuple_getSizeInBytes(arguments[0]);
    size_t startIndex = sysbvm_tuple_size_decode(arguments[1]);
    size_t endIndex = sysbvm_tuple_size_decode(arguments[2]);
    if(endIndex >= size)
        endIndex = size;
    
    size_t copySize = startIndex <= endIndex ? endIndex - startIndex : 0;
    sysbvm_tuple_t arrayType = sysbvm_tuple_getType(context, arguments[0]);

    if(copySize == 0)
    {
        sysbvm_type_tuple_t *arrayTypeObject = (sysbvm_type_tuple_t*)arrayType;
        if(!arrayTypeObject->emptyTrivialSingleton)
            arrayTypeObject->emptyTrivialSingleton = (sysbvm_tuple_t)sysbvm_context_allocateByteTuple(context, arrayType, 0);
        return arrayTypeObject->emptyTrivialSingleton;
    }

    sysbvm_byteArray_t *copy = (sysbvm_byteArray_t *)sysbvm_context_allocateByteTuple(context, arrayType, copySize);

    memcpy(copy->elements, array->elements + startIndex, copySize);
    return (sysbvm_tuple_t)copy;
}